

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ast.h
# Opt level: O3

void __thiscall
wabt::AST::Get<(wabt::ExprType)26>(AST *this,VarExpr<(wabt::ExprType)26> *ve,bool local)

{
  size_t sVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>,_bool>
  pVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>
  local_60;
  
  if ((int)CONCAT71(in_register_00000011,local) != 0) {
    if ((ve->var).type_ != Name) {
      __assert_fail("is_name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/ir.h"
                    ,0x3f,"const std::string &wabt::Var::name() const");
    }
    sVar1 = this->cur_block_id;
    local_60.first._M_dataplus._M_p = (pointer)&local_60.first.field_2;
    pcVar2 = (ve->var).field_2.name_._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar2,pcVar2 + (ve->var).field_2.name_._M_string_length);
    local_60.second.defined = false;
    local_60.second.block_id = sVar1;
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
            ::_M_insert_unique<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,wabt::AST::Variable>,std::_Select1st<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::AST::Variable>>>
                        *)&this->vars_defined,&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
      operator_delete(local_60.first._M_dataplus._M_p,
                      local_60.first.field_2._M_allocated_capacity + 1);
    }
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar3 = *(ulong *)(pVar5.first._M_node._M_node + 2);
      uVar4 = uVar3 + 0x3f;
      if (-1 < (long)uVar3) {
        uVar4 = uVar3;
      }
      if (((this->blocks_closed).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [((long)uVar4 >> 6) +
            (ulong)((uVar3 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar3 & 0x3f) & 1) == 0) goto LAB_0015c37c;
    }
    PreDecl<(wabt::ExprType)26>(this,ve);
  }
LAB_0015c37c:
  InsertNode(this,Expr,LocalTee,(Expr *)ve,0);
  return;
}

Assistant:

void Get(const VarExpr<T>& ve, bool local) {
    if (local) {
      auto ret = vars_defined.insert({ve.var.name(), {cur_block_id, false}});
      if (ret.second) {
        // Use before def, may happen since locals are guaranteed 0.
        PreDecl(ve);
      } else if (blocks_closed[ret.first->second.block_id]) {
        // This is a use of a variable that was defined in a block that has
        // already ended. This happens rarely, but we should cater for this
        // case by lifting it to the top scope.
        PreDecl(ve);
      }
    }
    InsertNode(NodeType::Expr, T, &ve, 0);
  }